

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O2

void __thiscall
tonk::SenderBandwidthControl::Initialize
          (SenderBandwidthControl *this,Dependencies *deps,Parameters *params)

{
  Parameters PVar1;
  Channel *pCVar2;
  uint64_t nowUsec;
  uint uVar3;
  
  pCVar2 = deps->Logger;
  (this->Deps).TimeSync = deps->TimeSync;
  (this->Deps).Logger = pCVar2;
  PVar1 = *params;
  this->Params = PVar1;
  this->RecoverySendCost = 0x19000;
  uVar3 = 13000;
  if (((ulong)PVar1 & 1) != 0) {
    uVar3 = PVar1.MaximumBPS;
  }
  (this->Shape).AppBPS = uVar3;
  nowUsec = siamese::GetTimeUsec();
  Timer::SetTimeoutUsec(&this->RecoveryTimer,100000,Restart);
  Timer::Start(&this->RecoveryTimer,nowUsec);
  return;
}

Assistant:

void SenderBandwidthControl::Initialize(
    const Dependencies& deps,
    const Parameters& params)
{
    Deps = deps;
    Params = params;

    // Set initial FEC rate
    static const float kInitialFECRate = 0.01f;
    RecoverySendCost = static_cast<int>(kReliableRewardTokens / kInitialFECRate);

    if (Params.IgnoreReceiverFeedback) {
        Shape.AppBPS = Params.MaximumBPS;
    }
    else {
        Shape.AppBPS = protocol::kBandwidthBurstTokenLimit;
    }

    // Set initial recovery timer
    const uint64_t nowUsec = siamese::GetTimeUsec();
    RecoveryTimer.SetTimeoutUsec(protocol::kInitialOWDUsec, Timer::Behavior::Restart);
    RecoveryTimer.Start(nowUsec);
}